

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hammersley.cpp
# Opt level: O2

void __thiscall pm::Hammersley::generateSamples(Hammersley *this)

{
  uint uVar1;
  uint uVar2;
  uint p;
  uint uVar3;
  uint j;
  uint uVar4;
  float x;
  float f;
  float fVar5;
  Vector2 pv;
  value_type local_30;
  
  for (uVar3 = 0; uVar3 < (this->super_Sampler).numSets_; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; uVar1 = (this->super_Sampler).numSamples_, uVar4 < uVar1; uVar4 = uVar4 + 1) {
      local_30.y = 0.0;
      fVar5 = 0.5;
      for (uVar2 = uVar4; uVar2 != 0; uVar2 = uVar2 >> 1) {
        local_30.y = local_30.y + (float)(uVar2 & 1) * fVar5;
        fVar5 = fVar5 * 0.5;
      }
      local_30.x = (float)uVar4 / (float)uVar1;
      std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
                (&(this->super_Sampler).samples_,&local_30);
    }
  }
  return;
}

Assistant:

void Hammersley::generateSamples()
{
	for (unsigned int p = 0; p < numSets_; p++)
	{
		for (unsigned int j = 0; j < numSamples_; j++)
		{
			const Vector2 pv(static_cast<float>(j) / static_cast<float>(numSamples_), phi(j));
			samples_.push_back(pv);
		}
	}
}